

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

llb_buildsystem_command_t *
anon_unknown.dwarf_5b8e::depinfo_tester_tool_create_command(void *context,llb_data_t *name)

{
  llb_buildsystem_external_command_delegate_t delegate_00;
  llb_buildsystem_command_t *plVar1;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  _func_void_void_ptr *p_Stack_80;
  undefined8 local_78;
  llb_buildsystem_external_command_delegate_t delegate;
  llb_data_t *name_local;
  void *context_local;
  
  local_78 = 0;
  delegate.is_result_valid_with_fallback =
       (_func_bool_void_ptr_llb_buildsystem_command_t_ptr_llb_build_value_ptr_void_ptr__func_bool_void_ptr_llb_buildsystem_command_t_ptr_llb_build_value_ptr_ptr
        *)0x0;
  delegate.configure =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr__func_void_llb_buildsystem_command_t_ptr_llb_data_t_llb_data_t_ptr__func_void_llb_buildsystem_command_t_ptr_llb_data_t_llb_data_t_ptr_size_t_ptr__func_void_llb_buildsystem_command_t_ptr_llb_data_t_llb_data_t_ptr_llb_data_t_ptr_size_t_ptr
        *)0x0;
  delegate.context = (void *)0x0;
  delegate.get_signature = depinfo_tester_command_start;
  delegate.start = depinfo_tester_command_provide_value;
  delegate.provide_value = depinfo_tester_command_execute_command;
  delegate.execute_command =
       (_func_llb_buildsystem_command_result_t_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
        *)0x0;
  delegate.execute_command_ex =
       (_func_llb_build_value_ptr_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
        *)0x0;
  delegate.execute_command_detached =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr_void_ptr__func_void_void_ptr_llb_buildsystem_command_result_t_llb_build_value_ptr_ptr
        *)0x0;
  delegate.cancel_detached_command = (_func_void_void_ptr_llb_buildsystem_command_t_ptr *)0x0;
  delegate.is_result_valid =
       (_func_bool_void_ptr_llb_buildsystem_command_t_ptr_llb_build_value_ptr *)0x0;
  delegate.destroy_context = (_func_void_void_ptr *)name;
  memcpy(&local_d8,&local_78,0x60);
  delegate_00.configure =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr__func_void_llb_buildsystem_command_t_ptr_llb_data_t_llb_data_t_ptr__func_void_llb_buildsystem_command_t_ptr_llb_data_t_llb_data_t_ptr_size_t_ptr__func_void_llb_buildsystem_command_t_ptr_llb_data_t_llb_data_t_ptr_llb_data_t_ptr_size_t_ptr
        *)uStack_d0;
  delegate_00.context = (void *)local_d8;
  delegate_00.get_signature =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_data_t_ptr *)local_c8;
  delegate_00.start =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t
        *)uStack_c0;
  delegate_00.provide_value =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_build_value_ptr_uintptr_t
        *)local_b8;
  delegate_00.execute_command =
       (_func_llb_buildsystem_command_result_t_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
        *)uStack_b0;
  delegate_00.execute_command_ex =
       (_func_llb_build_value_ptr_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
        *)local_a8;
  delegate_00.execute_command_detached =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr_void_ptr__func_void_void_ptr_llb_buildsystem_command_result_t_llb_build_value_ptr_ptr
        *)uStack_a0;
  delegate_00.cancel_detached_command =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr *)local_98;
  delegate_00.is_result_valid =
       (_func_bool_void_ptr_llb_buildsystem_command_t_ptr_llb_build_value_ptr *)uStack_90;
  delegate_00.is_result_valid_with_fallback =
       (_func_bool_void_ptr_llb_buildsystem_command_t_ptr_llb_build_value_ptr_void_ptr__func_bool_void_ptr_llb_buildsystem_command_t_ptr_llb_build_value_ptr_ptr
        *)local_88;
  delegate_00.destroy_context = p_Stack_80;
  plVar1 = llb_buildsystem_external_command_create(name,delegate_00);
  return plVar1;
}

Assistant:

static llb_buildsystem_command_t*
depinfo_tester_tool_create_command(void *context, const llb_data_t* name) {
  llb_buildsystem_external_command_delegate_t delegate;
  delegate.context = NULL;
  delegate.destroy_context = NULL;
  delegate.get_signature = NULL;
  delegate.configure = NULL;
  delegate.start = depinfo_tester_command_start;
  delegate.provide_value = depinfo_tester_command_provide_value;
  delegate.execute_command = depinfo_tester_command_execute_command;
  delegate.execute_command_ex = NULL;
  delegate.execute_command_detached = NULL;
  delegate.cancel_detached_command = NULL;
  delegate.is_result_valid = NULL;
  delegate.is_result_valid_with_fallback = NULL;
  return llb_buildsystem_external_command_create(name, delegate);
}